

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O1

void * lys_ext_complex_get_substmt(LY_STMT stmt,lys_ext_instance_complex *ext,lyext_substmt **info)

{
  lyext_substmt *plVar1;
  lyext_plugin *plVar2;
  long lVar3;
  LY_ERR *pLVar4;
  lyext_substmt *plVar5;
  LY_STMT LVar6;
  
  if ((((ext == (lys_ext_instance_complex *)0x0) || (ext->def == (lys_ext *)0x0)) ||
      (plVar2 = ext->def->plugin, plVar2 == (lyext_plugin *)0x0)) || (plVar2->type != LYEXT_COMPLEX)
     ) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
  }
  else {
    plVar5 = ext->substmt;
    if (plVar5 == (lyext_substmt *)0x0) {
      if (info != (lyext_substmt **)0x0) {
        *info = (lyext_substmt *)0x0;
      }
    }
    else {
      lVar3 = 0;
      LVar6 = plVar5->stmt;
      while (LVar6 != LY_STMT_UNKNOWN) {
        if (stmt == LY_STMT_NODE) {
          if ((uint)(LVar6 + ~LY_STMT_MODULE) < 0xe) goto LAB_00165fa6;
        }
        else if (LVar6 == stmt) {
LAB_00165fa6:
          if (info != (lyext_substmt **)0x0) {
            *info = plVar5;
          }
          break;
        }
        lVar3 = lVar3 + 1;
        plVar1 = plVar5 + 1;
        plVar5 = plVar5 + 1;
        LVar6 = plVar1->stmt;
      }
      if (ext->substmt[lVar3].stmt != LY_STMT_UNKNOWN) {
        return &ext->field_0x3c + ext->substmt[lVar3].offset;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

API void *
lys_ext_complex_get_substmt(LY_STMT stmt, struct lys_ext_instance_complex *ext, struct lyext_substmt **info)
{
    int i;

    if (!ext || !ext->def || !ext->def->plugin || ext->def->plugin->type != LYEXT_COMPLEX) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (!ext->substmt) {
        /* no substatement defined in the plugin */
        if (info) {
            *info = NULL;
        }
        return NULL;
    }

    /* search the substatements defined by the plugin */
    for (i = 0; ext->substmt[i].stmt; i++) {
        if (stmt == LY_STMT_NODE) {
            if (ext->substmt[i].stmt >= LY_STMT_ACTION && ext->substmt[i].stmt <= LY_STMT_USES) {
                if (info) {
                    *info = &ext->substmt[i];
                }
                break;
            }
        } else if (ext->substmt[i].stmt == stmt) {
            if (info) {
                *info = &ext->substmt[i];
            }
            break;
        }
    }

    if (ext->substmt[i].stmt) {
        return &ext->content[ext->substmt[i].offset];
    } else {
        return NULL;
    }
}